

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poller.cpp
# Opt level: O3

void __thiscall Liby::Poller::runAfterLoopHandlers(Poller *this)

{
  list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *this_00;
  _List_node_base *p_Var1;
  
  this_00 = &this->afterLoopHandlers_;
  p_Var1 = (this->afterLoopHandlers_).
           super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  if (p_Var1 != (_List_node_base *)this_00) {
    do {
      if (p_Var1[2]._M_next == (_List_node_base *)0x0) {
        std::__throw_bad_function_call();
      }
      (*(code *)p_Var1[2]._M_prev)(p_Var1 + 1);
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)this_00);
    std::__cxx11::_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::
    _M_clear(&this_00->
              super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>);
    (this->afterLoopHandlers_).
    super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
    _M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
    (this->afterLoopHandlers_).
    super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
    (this->afterLoopHandlers_).
    super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
    _M_node._M_size = 0;
  }
  return;
}

Assistant:

void Poller::runAfterLoopHandlers() {
    if (afterLoopHandlers_.empty())
        return;
    for (auto &handler : afterLoopHandlers_)
        handler();
    afterLoopHandlers_.clear();
}